

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parseInstrument(Parser *this,QString *data,qsizetype offset)

{
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  int iVar5;
  ulong from;
  ulong from_00;
  qsizetype qVar6;
  qsizetype qVar7;
  storage_type_conflict *psVar8;
  QString *str;
  storage_type_conflict *size;
  QArrayData *extraout_RDX;
  QArrayData *str_00;
  QString *str_01;
  qsizetype in_R8;
  CaseSensitivity in_R9D;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView haystack;
  QStringView haystack_00;
  QStringView rhs;
  QString local_120;
  QString local_108;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  Function local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.className.d.d = (Data *)(data->d).ptr;
  local_88.className.d.ptr = (char16_t *)(data->d).size;
  from = QStringView::indexOf((QStringView *)&local_88,(QChar)0x28,offset,CaseSensitive);
  local_88.className.d.d = (Data *)(data->d).ptr;
  local_88.className.d.ptr = (char16_t *)(data->d).size;
  from_00 = QStringView::indexOf((QStringView *)&local_88,(QChar)0x29,from,CaseSensitive);
  local_88.functionParameters.d.d = (Data *)0x0;
  local_88.functionParameters.d.ptr = (storage_type_conflict *)0x0;
  local_88.functionName.d.ptr = (storage_type_conflict *)0x0;
  local_88.functionName.d.size = 0;
  local_88.className.d.size = 0;
  local_88.functionName.d.d = (Data *)0x0;
  local_88.className.d.d = (Data *)0x0;
  local_88.className.d.ptr = (storage_type_conflict *)0x0;
  local_88.functionParameters.d.size = 0;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid(&local_c8,data,from + 1,~from + from_00);
  QString::simplified_helper(&local_a8,&local_c8,str);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((storage_type_conflict *)local_a8.d.size !=
       (storage_type_conflict *)(this->m_provider).d.size) ||
     (lhs.m_size = (qsizetype)(this->m_provider).d.ptr,
     lhs.m_data = (storage_type_conflict *)local_a8.d.size, rhs.m_size = in_R8,
     rhs.m_data = (storage_type_conflict *)local_a8.d.size,
     bVar4 = QtPrivate::equalStrings((QtPrivate *)local_a8.d.ptr,lhs,rhs), !bVar4))
  goto LAB_00107e63;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = L"::";
  local_c8.d.size = 2;
  qVar6 = QString::indexOf(data,&local_c8,from_00,CaseSensitive);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_c8.d.d = (Data *)(data->d).ptr;
  local_c8.d.ptr = (char16_t *)(data->d).size;
  qVar7 = QStringView::indexOf((QStringView *)&local_c8,(QChar)0x7b,qVar6,CaseSensitive);
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid(&local_c8,data,from_00 + 1,~from_00 + qVar6);
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid(&local_e8,data,qVar6 + 2,(qVar7 - qVar6) + -2);
  qVar6 = local_c8.d.size;
  haystack.m_size = -1;
  haystack.m_data = (storage_type_conflict *)local_c8.d.size;
  qVar7 = QtPrivate::lastIndexOf((QtPrivate *)local_c8.d.ptr,haystack,0x20,L'\x01',in_R9D);
  iVar5 = (int)qVar7;
  if (iVar5 == -1) {
    QString::operator=(&local_88.className,&local_c8);
  }
  else {
    QString::mid(&local_108,&local_c8,(long)(iVar5 + 1),(qsizetype)(qVar6 + ~(long)iVar5));
    pcVar3 = local_88.className.d.ptr;
    pDVar2 = local_88.className.d.d;
    qVar6 = local_108.d.size;
    pDVar1 = local_108.d.d;
    local_108.d.d = local_88.className.d.d;
    local_88.className.d.d = pDVar1;
    local_88.className.d.ptr = local_108.d.ptr;
    local_108.d.ptr = pcVar3;
    local_108.d.size = local_88.className.d.size;
    local_88.className.d.size = qVar6;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
  }
  local_108.d.d = (Data *)local_e8.d.ptr;
  local_108.d.ptr = (char16_t *)local_e8.d.size;
  psVar8 = (storage_type_conflict *)
           QStringView::indexOf((QStringView *)&local_108,(QChar)0x28,0,CaseSensitive);
  local_108.d.d = (Data *)local_e8.d.ptr;
  local_108.d.ptr = (char16_t *)local_e8.d.size;
  qVar6 = QStringView::indexOf((QStringView *)&local_108,(QChar)0x20,0,CaseSensitive);
  size = (storage_type_conflict *)(long)(int)qVar6;
  if ((long)size < (long)psVar8) {
    if ((ulong)local_e8.d.size <= size) goto LAB_00107c97;
LAB_00107c90:
    QString::QString(&local_120,(QChar *)local_e8.d.ptr,(qsizetype)size);
    str_00 = extraout_RDX;
  }
  else {
    size = psVar8;
    if (psVar8 < (ulong)local_e8.d.size) goto LAB_00107c90;
LAB_00107c97:
    local_120.d.d = local_e8.d.d;
    local_120.d.ptr = local_e8.d.ptr;
    local_120.d.size = local_e8.d.size;
    str_00 = (QArrayData *)local_e8.d.ptr;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QString::simplified_helper(&local_108,&local_120,(QString *)str_00);
  pcVar3 = local_88.functionName.d.ptr;
  pDVar2 = local_88.functionName.d.d;
  qVar6 = local_108.d.size;
  pDVar1 = local_108.d.d;
  local_108.d.d = local_88.functionName.d.d;
  local_88.functionName.d.d = pDVar1;
  local_88.functionName.d.ptr = local_108.d.ptr;
  local_108.d.ptr = pcVar3;
  local_108.d.size = local_88.functionName.d.size;
  local_88.functionName.d.size = qVar6;
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
    }
  }
  haystack_00.m_size = -1;
  haystack_00.m_data = (storage_type_conflict *)local_e8.d.size;
  qVar6 = QtPrivate::lastIndexOf((QtPrivate *)local_e8.d.ptr,haystack_00,0x29,L'\x01',in_R9D);
  QString::mid(&local_120,&local_e8,(qsizetype)((long)psVar8 + 1),~(ulong)psVar8 + qVar6);
  QString::simplified_helper(&local_108,&local_120,str_01);
  pcVar3 = local_88.functionParameters.d.ptr;
  pDVar2 = local_88.functionParameters.d.d;
  qVar6 = local_108.d.size;
  pDVar1 = local_108.d.d;
  local_108.d.d = local_88.functionParameters.d.d;
  local_88.functionParameters.d.d = pDVar1;
  local_88.functionParameters.d.ptr = local_108.d.ptr;
  local_108.d.ptr = pcVar3;
  local_108.d.size = local_88.functionParameters.d.size;
  local_88.functionParameters.d.size = qVar6;
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::QGenericArrayOps<Function>::emplace<Function_const&>
            ((QGenericArrayOps<Function> *)this,(this->m_functions).d.size,&local_88);
  QList<Function>::end(&this->m_functions);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00107e63:
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.functionParameters.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.functionParameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((local_88.functionParameters.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.functionParameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate(&(local_88.functionParameters.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.functionName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.functionName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.functionName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_88.functionName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_88.functionName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Parser::parseInstrument(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(')'), beginOfProvider);
    Function func;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype classMarker = data.indexOf(QStringLiteral("::"), endOfProvider);
    qsizetype beginOfFunctionMarker = data.indexOf(QLatin1Char('{'), classMarker);
    QString begin = data.mid(endOfProvider + 1, classMarker - endOfProvider - 1);
    QString end = data.mid(classMarker + 2, beginOfFunctionMarker - classMarker - 2);
    int spaceIndex = begin.lastIndexOf(QLatin1Char(' '));
    if (spaceIndex == -1)
        func.className = begin;
    else
        func.className = begin.mid(spaceIndex + 1, begin.length() - spaceIndex - 1);
    qsizetype braceIndex = end.indexOf(QLatin1Char('('));
    spaceIndex = end.indexOf(QLatin1Char(' '));
    if (spaceIndex < braceIndex)
        func.functionName = end.left(spaceIndex).simplified();
    else
        func.functionName = end.left(braceIndex).simplified();

    qsizetype lastBraceIndex = end.lastIndexOf(QLatin1Char(')'));
    func.functionParameters = end.mid(braceIndex + 1, lastBraceIndex - braceIndex - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(func.functionName), qPrintable(func.functionParameters)));

    m_functions.push_back(func);
}